

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

void __thiscall
FIX::SocketMonitor::processPollList
          (SocketMonitor *this,Strategy *strategy,pollfd *pfds,uint pfds_size)

{
  ulong uVar1;
  
  if (pfds_size != 0) {
    uVar1 = 0;
    do {
      if ((pfds[uVar1].revents & 3) != 0) {
        processRead(this,strategy,pfds[uVar1].fd);
      }
      if ((pfds[uVar1].revents & 4) != 0) {
        processWrite(this,strategy,pfds[uVar1].fd);
      }
      if ((pfds[uVar1].revents & 8) != 0) {
        (*strategy->_vptr_Strategy[5])(strategy,this,(ulong)(uint)pfds[uVar1].fd);
      }
      uVar1 = uVar1 + 1;
    } while (pfds_size != uVar1);
  }
  return;
}

Assistant:

void SocketMonitor::processPollList(Strategy &strategy, struct pollfd *pfds, unsigned pfds_size) {
  for (unsigned i = 0; i < pfds_size; ++i) {
    if ((pfds[i].revents & POLLIN) || (pfds[i].revents & POLLPRI)) {
      processRead(strategy, pfds[i].fd);
    }

    if ((pfds[i].revents & POLLOUT)) {
      processWrite(strategy, pfds[i].fd);
    }
    if ((pfds[i].revents & POLLERR)) {
      processError(strategy, pfds[i].fd);
    }
  }
}